

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *dc,ImGuiDockNode *node,int depth)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  uint uVar10;
  int iVar11;
  ImGuiWindow *pIVar12;
  ImGuiDockNodeSettings *pIVar13;
  ImGuiDockNodeSettings *__dest;
  int iVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  undefined1 uVar17;
  int iVar18;
  
  while( true ) {
    if (0xff < depth) {
      __assert_fail("depth < (1 << (sizeof(node_settings.Depth) << 3))",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3fae,
                    "void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *, ImGuiDockNode *, int)"
                   );
    }
    IVar16 = 0;
    if (node->ParentNode != (ImGuiDockNode *)0x0) {
      IVar16 = node->ParentNode->ID;
    }
    IVar15 = 0;
    if ((((node->MergedFlags & 0x400) != 0) && (IVar15 = 0, node->HostWindow != (ImGuiWindow *)0x0))
       && (pIVar12 = node->HostWindow->ParentWindow, pIVar12 != (ImGuiWindow *)0x0)) {
      IVar15 = pIVar12->ID;
    }
    if (node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
      uVar17 = 0xff;
    }
    else {
      uVar17 = (undefined1)node->SplitAxis;
    }
    fVar2 = (node->Pos).x;
    fVar3 = (node->Pos).y;
    fVar4 = (node->Size).x;
    IVar8 = node->ID;
    fVar5 = (node->Size).y;
    IVar9 = node->SelectedTabId;
    fVar6 = (node->SizeRef).x;
    uVar10 = node->LocalFlags;
    fVar7 = (node->SizeRef).y;
    iVar18 = (dc->NodesSettings).Size;
    iVar11 = (dc->NodesSettings).Capacity;
    if (iVar18 == iVar11) {
      if (iVar11 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar11 / 2 + iVar11;
      }
      iVar18 = iVar18 + 1;
      if (iVar18 < iVar14) {
        iVar18 = iVar14;
      }
      if (iVar11 < iVar18) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiDockNodeSettings *)
                 (*GImAllocatorAllocFunc)((long)iVar18 * 0x24,GImAllocatorUserData);
        pIVar13 = (dc->NodesSettings).Data;
        if (pIVar13 != (ImGuiDockNodeSettings *)0x0) {
          memcpy(__dest,pIVar13,(long)(dc->NodesSettings).Size * 0x24);
          pIVar13 = (dc->NodesSettings).Data;
          if ((pIVar13 != (ImGuiDockNodeSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
        }
        (dc->NodesSettings).Data = __dest;
        (dc->NodesSettings).Capacity = iVar18;
      }
    }
    pIVar13 = (dc->NodesSettings).Data;
    iVar18 = (dc->NodesSettings).Size;
    pIVar13[iVar18].ID = IVar8;
    pIVar13[iVar18].ParentNodeId = IVar16;
    pIVar13[iVar18].ParentWindowId = IVar15;
    pIVar13[iVar18].SelectedTabId = IVar9;
    pIVar13[iVar18].SplitAxis = uVar17;
    pIVar13[iVar18].Depth = (char)depth;
    *(undefined2 *)&pIVar13[iVar18].field_0x12 = 0;
    pIVar13[iVar18].Flags = uVar10 & 0xc1fc20;
    pIVar13[iVar18].Pos = (ImVec2ih)((int)fVar2 & 0xffffU | (int)fVar3 << 0x10);
    pIVar13[iVar18].Size = (ImVec2ih)((int)fVar4 & 0xffffU | (int)fVar5 << 0x10);
    pIVar13[iVar18].SizeRef = (ImVec2ih)((int)fVar6 & 0xffffU | (int)fVar7 << 0x10);
    (dc->NodesSettings).Size = (dc->NodesSettings).Size + 1;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockSettingsHandler_DockNodeToSettings(dc,node->ChildNodes[0],depth + 1);
    }
    node = node->ChildNodes[1];
    if (node == (ImGuiDockNode *)0x0) break;
    depth = depth + 1;
  }
  return;
}

Assistant:

static void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext* dc, ImGuiDockNode* node, int depth)
{
    ImGuiDockNodeSettings node_settings;
    IM_ASSERT(depth < (1 << (sizeof(node_settings.Depth) << 3)));
    node_settings.ID = node->ID;
    node_settings.ParentNodeId = node->ParentNode ? node->ParentNode->ID : 0;
    node_settings.ParentWindowId = (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow) ? node->HostWindow->ParentWindow->ID : 0;
    node_settings.SelectedTabId = node->SelectedTabId;
    node_settings.SplitAxis = (signed char)(node->IsSplitNode() ? node->SplitAxis : ImGuiAxis_None);
    node_settings.Depth = (char)depth;
    node_settings.Flags = (node->LocalFlags & ImGuiDockNodeFlags_SavedFlagsMask_);
    node_settings.Pos = ImVec2ih(node->Pos);
    node_settings.Size = ImVec2ih(node->Size);
    node_settings.SizeRef = ImVec2ih(node->SizeRef);
    dc->NodesSettings.push_back(node_settings);
    if (node->ChildNodes[0])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[0], depth + 1);
    if (node->ChildNodes[1])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[1], depth + 1);
}